

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O3

ParquetStatisticsUtils * __thiscall
duckdb::ParquetStatisticsUtils::ConvertValue
          (ParquetStatisticsUtils *this,LogicalType *type,ParquetColumnSchema *schema_ele,
          string *stats)

{
  char cVar1;
  string error;
  Value result;
  Value stats_val;
  LogicalType aLStack_f8 [24];
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  LogicalType local_c0 [24];
  Value local_a8 [64];
  ParquetStatisticsUtils local_68 [64];
  
  duckdb::LogicalType::LogicalType(local_c0,SQLNULL);
  duckdb::Value::Value(local_a8,local_c0);
  duckdb::LogicalType::~LogicalType(local_c0);
  local_d8 = 0;
  local_d0[0] = 0;
  local_e0 = local_d0;
  ConvertValueInternal(local_68,type,schema_ele,stats);
  cVar1 = duckdb::Value::DefaultTryCastAs
                    ((LogicalType *)local_68,(Value *)type,(string *)local_a8,SUB81(&local_e0,0));
  if (cVar1 == '\0') {
    duckdb::LogicalType::LogicalType(aLStack_f8,type);
    duckdb::Value::Value((Value *)this,aLStack_f8);
    duckdb::LogicalType::~LogicalType(aLStack_f8);
  }
  else {
    duckdb::Value::Value((Value *)this,local_a8);
  }
  duckdb::Value::~Value((Value *)local_68);
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  duckdb::Value::~Value(local_a8);
  return this;
}

Assistant:

Value ParquetStatisticsUtils::ConvertValue(const LogicalType &type, const ParquetColumnSchema &schema_ele,
                                           const std::string &stats) {
	Value result;
	string error;
	auto stats_val = ConvertValueInternal(type, schema_ele, stats);
	if (!stats_val.DefaultTryCastAs(type, result, &error)) {
		return Value(type);
	}
	return result;
}